

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O0

JavaType google::protobuf::compiler::javanano::GetJavaType(Type field_type)

{
  LogMessage *other;
  LogFinisher local_55 [13];
  LogMessage local_48;
  Type local_10;
  JavaType local_c;
  Type field_type_local;
  
  switch(field_type) {
  case TYPE_DOUBLE:
    local_c = JAVATYPE_DOUBLE;
    break;
  case TYPE_FLOAT:
    local_c = JAVATYPE_FLOAT;
    break;
  case TYPE_INT64:
  case TYPE_UINT64:
  case TYPE_FIXED64:
  case TYPE_SFIXED64:
  case MAX_TYPE:
    local_c = JAVATYPE_LONG;
    break;
  case TYPE_INT32:
  case TYPE_FIXED32:
  case TYPE_UINT32:
  case TYPE_SFIXED32:
  case TYPE_SINT32:
    local_c = JAVATYPE_INT;
    break;
  case TYPE_BOOL:
    local_c = JAVATYPE_BOOLEAN;
    break;
  case TYPE_STRING:
    local_c = JAVATYPE_STRING;
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    local_c = JAVATYPE_MESSAGE;
    break;
  case TYPE_BYTES:
    local_c = JAVATYPE_BYTES;
    break;
  case TYPE_ENUM:
    local_c = JAVATYPE_ENUM;
    break;
  default:
    local_10 = field_type;
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_helpers.cc"
               ,0x153);
    other = internal::LogMessage::operator<<(&local_48,"Can\'t get here.");
    internal::LogFinisher::operator=(local_55,other);
    internal::LogMessage::~LogMessage(&local_48);
    local_c = JAVATYPE_INT;
  }
  return local_c;
}

Assistant:

JavaType GetJavaType(FieldDescriptor::Type field_type) {
  switch (field_type) {
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_SFIXED32:
      return JAVATYPE_INT;

    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED64:
      return JAVATYPE_LONG;

    case FieldDescriptor::TYPE_FLOAT:
      return JAVATYPE_FLOAT;

    case FieldDescriptor::TYPE_DOUBLE:
      return JAVATYPE_DOUBLE;

    case FieldDescriptor::TYPE_BOOL:
      return JAVATYPE_BOOLEAN;

    case FieldDescriptor::TYPE_STRING:
      return JAVATYPE_STRING;

    case FieldDescriptor::TYPE_BYTES:
      return JAVATYPE_BYTES;

    case FieldDescriptor::TYPE_ENUM:
      return JAVATYPE_ENUM;

    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
      return JAVATYPE_MESSAGE;

    // No default because we want the compiler to complain if any new
    // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return JAVATYPE_INT;
}